

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_serialize(void)

{
  undefined4 uVar1;
  size_t sVar2;
  void *pvVar3;
  uint64_t uVar4;
  uint32_t *puVar5;
  uint64_t uVar6;
  uint32_t *puVar7;
  roaring_bitmap_t *r2_00;
  roaring_bitmap_t *r1_00;
  char *expression;
  roaring_bitmap_t *new_bm;
  uint32_t size;
  char *buff;
  uint i_2;
  roaring_bitmap_t *old_bm;
  uint32_t k;
  roaring_bitmap_t *t_safe;
  int i_1;
  run_container_t *run;
  uint32_t *arr2;
  uint64_t card2;
  uint32_t *arr1;
  uint64_t card1;
  int top_val;
  int i;
  roaring_bitmap_t *r2;
  char *serialized;
  uint32_t serialize_len;
  roaring_bitmap_t *r1;
  uint32_t *in_stack_ffffffffffffff08;
  int iVar8;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  undefined2 uVar9;
  uint16_t in_stack_ffffffffffffff16;
  undefined2 uVar10;
  run_container_t *in_stack_ffffffffffffff18;
  roaring_array_t *in_stack_ffffffffffffff20;
  roaring_bitmap_t *in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  void *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar11;
  uint local_a0;
  int local_74;
  int local_44;
  undefined1 local_2c [36];
  roaring_bitmap_t *local_8;
  
  memcpy(local_2c,&DAT_0018c42c,0x24);
  local_8 = roaring_bitmap_of_ptr
                      (CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                       in_stack_ffffffffffffff08);
  _assert_true((unsigned_long)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  for (local_44 = 0; local_44 < 0x5dc00; local_44 = local_44 + 1) {
    roaring_bitmap_add((roaring_bitmap_t *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  }
  sVar2 = roaring_bitmap_size_in_bytes((roaring_bitmap_t *)in_stack_ffffffffffffff20);
  pvVar3 = malloc(sVar2);
  roaring_bitmap_serialize(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
  roaring_bitmap_size_in_bytes((roaring_bitmap_t *)in_stack_ffffffffffffff20);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff20,
                    (unsigned_long)in_stack_ffffffffffffff18,
                    (char *)CONCAT26(in_stack_ffffffffffffff16,
                                     CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_deserialize(in_stack_ffffffffffffff38);
  _assert_true((unsigned_long)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  uVar4 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)in_stack_ffffffffffffff20);
  puVar5 = (uint32_t *)malloc(uVar4 << 2);
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff08);
  uVar6 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)in_stack_ffffffffffffff20);
  puVar7 = (uint32_t *)malloc(uVar6 << 2);
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff08);
  array_equals(puVar5,(int32_t)uVar4,puVar7,(int32_t)uVar6);
  _assert_true((unsigned_long)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_equals(in_stack_ffffffffffffff28,(roaring_bitmap_t *)in_stack_ffffffffffffff20);
  _assert_true((unsigned_long)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  free(puVar5);
  free(puVar7);
  free(pvVar3);
  roaring_bitmap_free((roaring_bitmap_t *)0x10f6ee);
  roaring_bitmap_free((roaring_bitmap_t *)0x10f6fb);
  run_container_create_given_capacity((int32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  _assert_true((unsigned_long)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  for (local_74 = 0; local_74 < 0x300; local_74 = local_74 + 1) {
    run_container_add(in_stack_ffffffffffffff18,in_stack_ffffffffffffff16);
  }
  local_8 = roaring_bitmap_create_with_capacity
                      ((uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  ra_append(in_stack_ffffffffffffff20,(uint16_t)((ulong)in_stack_ffffffffffffff18 >> 0x30),
            (container_t *)
            CONCAT26(in_stack_ffffffffffffff16,
                     CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
            (uint8_t)((ulong)in_stack_ffffffffffffff08 >> 0x38));
  sVar2 = roaring_bitmap_size_in_bytes((roaring_bitmap_t *)in_stack_ffffffffffffff20);
  pvVar3 = malloc(sVar2 & 0xffffffff);
  r2_00 = (roaring_bitmap_t *)(long)(int)sVar2;
  roaring_bitmap_serialize(in_stack_ffffffffffffff28,(char *)r2_00);
  _assert_int_equal((unsigned_long)r2_00,(unsigned_long)in_stack_ffffffffffffff18,
                    (char *)CONCAT26(in_stack_ffffffffffffff16,
                                     CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_deserialize(in_stack_ffffffffffffff38);
  roaring_bitmap_equals(in_stack_ffffffffffffff28,r2_00);
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_deserialize_safe
            (in_stack_ffffffffffffff48,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
            );
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_deserialize_safe
            (in_stack_ffffffffffffff48,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
            );
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_deserialize_safe
            (in_stack_ffffffffffffff48,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
            );
  roaring_bitmap_equals(in_stack_ffffffffffffff28,r2_00);
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_free((roaring_bitmap_t *)0x10f920);
  roaring_bitmap_deserialize_safe
            (in_stack_ffffffffffffff48,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
            );
  roaring_bitmap_equals(in_stack_ffffffffffffff28,r2_00);
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_free((roaring_bitmap_t *)0x10f97b);
  free(pvVar3);
  roaring_bitmap_free((roaring_bitmap_t *)0x10f995);
  roaring_bitmap_free((roaring_bitmap_t *)0x10f9a2);
  local_8 = roaring_bitmap_of_ptr
                      (CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                       in_stack_ffffffffffffff08);
  sVar2 = roaring_bitmap_size_in_bytes(r2_00);
  pvVar3 = malloc(sVar2);
  sVar2 = roaring_bitmap_serialize(in_stack_ffffffffffffff28,(char *)r2_00);
  r1_00 = (roaring_bitmap_t *)(sVar2 & 0xffffffff);
  roaring_bitmap_size_in_bytes(r2_00);
  _assert_int_equal((unsigned_long)r2_00,(unsigned_long)in_stack_ffffffffffffff18,
                    (char *)CONCAT26(in_stack_ffffffffffffff16,
                                     CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_deserialize(in_stack_ffffffffffffff38);
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  uVar4 = roaring_bitmap_get_cardinality(r2_00);
  puVar5 = (uint32_t *)malloc(uVar4 << 2);
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff08);
  uVar6 = roaring_bitmap_get_cardinality(r2_00);
  puVar7 = (uint32_t *)malloc(uVar6 << 2);
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff08);
  array_equals(puVar5,(int32_t)uVar4,puVar7,(int32_t)uVar6);
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_equals(r1_00,r2_00);
  _assert_true((unsigned_long)r2_00,(char *)in_stack_ffffffffffffff18,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  free(puVar5);
  free(puVar7);
  free(pvVar3);
  roaring_bitmap_free((roaring_bitmap_t *)0x10fbfd);
  roaring_bitmap_free((roaring_bitmap_t *)0x10fc0a);
  local_8 = roaring_bitmap_create();
  for (local_a0 = 100; local_a0 < 100000; local_a0 = local_a0 + 1) {
    roaring_bitmap_add((roaring_bitmap_t *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  }
  roaring_bitmap_run_optimize(r2_00);
  sVar2 = roaring_bitmap_size_in_bytes(r2_00);
  pvVar3 = malloc(sVar2);
  sVar2 = roaring_bitmap_serialize(r1_00,(char *)r2_00);
  expression = (char *)(sVar2 & 0xffffffff);
  roaring_bitmap_size_in_bytes(r2_00);
  _assert_int_equal((unsigned_long)r2_00,(unsigned_long)expression,
                    (char *)CONCAT26(in_stack_ffffffffffffff16,
                                     CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_deserialize(in_stack_ffffffffffffff38);
  uVar4 = roaring_bitmap_get_cardinality(r2_00);
  puVar5 = (uint32_t *)malloc(uVar4 << 2);
  _assert_true((unsigned_long)r2_00,expression,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff08);
  uVar6 = roaring_bitmap_get_cardinality(r2_00);
  puVar7 = (uint32_t *)malloc(uVar6 << 2);
  _assert_true((unsigned_long)r2_00,expression,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
  roaring_bitmap_to_uint32_array
            ((roaring_bitmap_t *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff08);
  iVar8 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  array_equals(puVar5,(int32_t)uVar4,puVar7,(int32_t)uVar6);
  _assert_true((unsigned_long)r2_00,expression,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),iVar8
              );
  roaring_bitmap_equals(r1_00,r2_00);
  _assert_true((unsigned_long)r2_00,expression,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),iVar8
              );
  free(puVar5);
  free(puVar7);
  free(pvVar3);
  roaring_bitmap_free((roaring_bitmap_t *)0x10fe46);
  roaring_bitmap_free((roaring_bitmap_t *)0x10fe53);
  roaring_bitmap_create();
  for (uVar11 = 0; uVar11 < 0x66; uVar11 = uVar11 + 1) {
    roaring_bitmap_add((roaring_bitmap_t *)CONCAT44(uVar11,in_stack_ffffffffffffff50),
                       (uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  }
  sVar2 = roaring_bitmap_size_in_bytes(r2_00);
  pvVar3 = malloc(sVar2);
  sVar2 = roaring_bitmap_serialize(r1_00,(char *)r2_00);
  uVar1 = (undefined4)sVar2;
  iVar8 = 0;
  roaring_bitmap_size_in_bytes(r2_00);
  _assert_int_equal((unsigned_long)r2_00,(unsigned_long)expression,
                    (char *)CONCAT26(in_stack_ffffffffffffff16,
                                     CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                    iVar8);
  roaring_bitmap_deserialize(in_stack_ffffffffffffff38);
  roaring_bitmap_deserialize_safe(pvVar3,CONCAT44(uVar1,in_stack_ffffffffffffff40));
  _assert_true((unsigned_long)r2_00,expression,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),iVar8
              );
  roaring_bitmap_deserialize_safe(pvVar3,CONCAT44(uVar1,in_stack_ffffffffffffff40));
  roaring_bitmap_equals(r1_00,r2_00);
  _assert_true((unsigned_long)r2_00,expression,
               (char *)CONCAT26(in_stack_ffffffffffffff16,
                                CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),iVar8
              );
  roaring_bitmap_free((roaring_bitmap_t *)0x10ff75);
  free(pvVar3);
  uVar4 = roaring_bitmap_get_cardinality(r2_00);
  uVar9 = (undefined2)uVar4;
  uVar10 = (undefined2)(uVar4 >> 0x10);
  roaring_bitmap_get_cardinality(r2_00);
  _assert_true((unsigned_long)r2_00,expression,
               (char *)CONCAT26(uVar10,CONCAT24(uVar9,in_stack_ffffffffffffff10)),iVar8);
  roaring_bitmap_equals(r1_00,r2_00);
  _assert_true((unsigned_long)r2_00,expression,
               (char *)CONCAT26(uVar10,CONCAT24(uVar9,in_stack_ffffffffffffff10)),iVar8);
  roaring_bitmap_free((roaring_bitmap_t *)0x10fffb);
  roaring_bitmap_free((roaring_bitmap_t *)0x110005);
  return;
}

Assistant:

DEFINE_TEST(test_serialize) {
    roaring_bitmap_t *r1 =
        roaring_bitmap_from(1, 2, 3, 100, 1000, 10000, 1000000, 20000000);
    assert_non_null(r1);

    uint32_t serialize_len;
    char *serialized;
    roaring_bitmap_t *r2;

    /* Add some values to the bitmap */
    for (int i = 0, top_val = 384000; i < top_val; i++)
        roaring_bitmap_add(r1, 3 * i);
    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_non_null(r2);

    uint64_t card1 = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r1, arr1);

    uint64_t card2 = roaring_bitmap_get_cardinality(r2);
    uint32_t *arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));
    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    /* manually create a run container, and inject ito a roaring bitmap */
    run_container_t *run = run_container_create_given_capacity(1024);
    assert_non_null(run);
    for (int i = 0; i < 768; i++) run_container_add(run, 3 * i);

    r1 = roaring_bitmap_create_with_capacity(1);
    ra_append(&r1->high_low_container, 0, run, RUN_CONTAINER_TYPE);

    serialize_len = roaring_bitmap_size_in_bytes(r1);
    serialized = (char *)malloc(serialize_len);
    assert_int_equal((int32_t)serialize_len,
                     roaring_bitmap_serialize(r1, serialized));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_true(roaring_bitmap_equals(r1, r2));

    // Check that roaring_bitmap_deserialize_safe fails on invalid length

    assert_null(roaring_bitmap_deserialize_safe(serialized, 0));
    assert_null(roaring_bitmap_deserialize_safe(serialized, serialize_len - 1));

    // Check that roaring_bitmap_deserialize_safe succeed with valid length

    roaring_bitmap_t *t_safe =
        roaring_bitmap_deserialize_safe(serialized, serialize_len);
    assert_true(roaring_bitmap_equals(r1, t_safe));
    roaring_bitmap_free(t_safe);

    // Check that roaring_bitmap_deserialize_safe succeed with larger length

    t_safe = roaring_bitmap_deserialize_safe(serialized, serialize_len + 10);
    assert_true(roaring_bitmap_equals(r1, t_safe));
    roaring_bitmap_free(t_safe);

    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    r1 = roaring_bitmap_from(2946000, 2997491, 10478289, 10490227, 10502444,
                             19866827);

    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);
    assert_non_null(r2);

    card1 = roaring_bitmap_get_cardinality(r1);
    arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_non_null(arr1);
    roaring_bitmap_to_uint32_array(r1, arr1);

    card2 = roaring_bitmap_get_cardinality(r2);
    arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    assert_non_null(arr2);
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));
    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    r1 = roaring_bitmap_create();
    for (uint32_t k = 100; k < 100000; ++k) {
        roaring_bitmap_add(r1, k);
    }
    roaring_bitmap_run_optimize(r1);
    serialized = (char *)malloc(roaring_bitmap_size_in_bytes(r1));
    serialize_len = roaring_bitmap_serialize(r1, serialized);
    assert_int_equal(serialize_len, roaring_bitmap_size_in_bytes(r1));
    r2 = roaring_bitmap_deserialize(serialized);

    card1 = roaring_bitmap_get_cardinality(r1);
    arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    assert_non_null(arr1);
    roaring_bitmap_to_uint32_array(r1, arr1);

    card2 = roaring_bitmap_get_cardinality(r2);
    arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    assert_non_null(arr2);
    roaring_bitmap_to_uint32_array(r2, arr2);

    assert_true(array_equals(arr1, card1, arr2, card2));
    assert_true(roaring_bitmap_equals(r1, r2));

    free(arr1);
    free(arr2);
    free(serialized);
    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);

    /* ******* */
    roaring_bitmap_t *old_bm = roaring_bitmap_create();
    for (unsigned i = 0; i < 102; i++) roaring_bitmap_add(old_bm, i);
    char *buff = (char *)malloc(roaring_bitmap_size_in_bytes(old_bm));
    uint32_t size = roaring_bitmap_serialize(old_bm, buff);
    assert_int_equal(size, roaring_bitmap_size_in_bytes(old_bm));
    roaring_bitmap_t *new_bm = roaring_bitmap_deserialize(buff);

    // Check that roaring_bitmap_deserialize_safe fails on invalid length
    assert_null(roaring_bitmap_deserialize_safe(buff, size - 1));
    // Check that roaring_bitmap_deserialize_safe succeed with valid length
    t_safe = roaring_bitmap_deserialize_safe(buff, size);
    assert_true(roaring_bitmap_equals(new_bm, t_safe));
    roaring_bitmap_free(t_safe);

    free(buff);
    assert_true((unsigned int)roaring_bitmap_get_cardinality(old_bm) ==
                (unsigned int)roaring_bitmap_get_cardinality(new_bm));
    assert_true(roaring_bitmap_equals(old_bm, new_bm));
    roaring_bitmap_free(old_bm);
    roaring_bitmap_free(new_bm);
}